

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

ostream * operator<<(ostream *os,cmMakeSafe *self)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = self->Data;
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '=') {
      std::operator<<(os,"$(EQUALS)");
    }
    else {
      if (cVar1 == '\0') {
        return os;
      }
      std::operator<<(os,cVar1);
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmMakeSafe const& self)
  {
    for (const char* c = self.Data; *c; ++c) {
      switch (*c) {
        case '=':
          os << "$(EQUALS)";
          break;
        default:
          os << *c;
          break;
      }
    }
    return os;
  }